

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffiblk(fitsfile *fptr,long nblock,int headdata,int *status)

{
  long lVar1;
  int iVar2;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  char card [81];
  char *tmpbuff;
  char *outbuff;
  char *inbuff;
  char buff2 [2880];
  char buff1 [2880];
  char charfill;
  long nshift;
  long ii;
  LONGLONG jpoint;
  LONGLONG insertpt;
  int typhdu;
  int savehdu;
  int tstatus;
  char *in_stack_ffffffffffffe8a8;
  undefined4 in_stack_ffffffffffffe8b0;
  int in_stack_ffffffffffffe8b4;
  undefined4 in_stack_ffffffffffffe8b8;
  int in_stack_ffffffffffffe8bc;
  undefined4 in_stack_ffffffffffffe8c0;
  int in_stack_ffffffffffffe8c4;
  fitsfile *in_stack_ffffffffffffe8c8;
  int *in_stack_ffffffffffffe8f0;
  void *in_stack_ffffffffffffe8f8;
  fitsfile *in_stack_ffffffffffffe900;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  fitsfile *status_00;
  fitsfile *in_stack_ffffffffffffe918;
  int in_stack_ffffffffffffe924;
  fitsfile *in_stack_ffffffffffffe928;
  fitsfile local_ba8 [180];
  byte local_59;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined4 local_30;
  int local_2c;
  int *local_28;
  int local_1c;
  long local_18;
  long local_10;
  int local_4;
  
  if ((*in_RCX < 1) && (0 < in_RSI)) {
    local_2c = *in_RCX;
    if ((in_EDX == 0) || (*(int *)(*(long *)(in_RDI + 8) + 0x58) == 1)) {
      local_59 = 0x20;
    }
    else {
      local_59 = 0;
    }
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (in_EDX == 0) {
      local_40 = *(long *)(*(long *)(in_RDI + 8) + 0x88);
    }
    else if (in_EDX == -1) {
      local_40 = 0;
      strcpy(&stack0xffffffffffffe8a8,"XTENSION= \'IMAGE   \'          / IMAGE extension");
    }
    else {
      local_40 = ((*(long *)(*(long *)(in_RDI + 8) + 0x88) +
                   *(long *)(*(long *)(in_RDI + 8) + 0x3d8) +
                   *(long *)(*(long *)(in_RDI + 8) + 0x3e0) + 0xb3f) / 0xb40) * 0xb40;
    }
    status_00 = local_ba8;
    fptr_00 = (fitsfile *)&stack0xffffffffffffe918;
    memset(fptr_00,(uint)local_59,0xb40);
    if (local_18 == 1) {
      if (local_1c == -1) {
        ffmrec((fitsfile *)CONCAT44(in_stack_ffffffffffffe8bc,in_stack_ffffffffffffe8b8),
               in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8a8,(int *)0x167d75);
      }
      ffmbyt(in_stack_ffffffffffffe8c8,CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0)
             ,in_stack_ffffffffffffe8bc,
             (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
      ffgbyt(fptr_00,(LONGLONG)in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
             in_stack_ffffffffffffe8f0);
      while (*local_28 < 1) {
        ffmbyt(in_stack_ffffffffffffe8c8,
               CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
               in_stack_ffffffffffffe8bc,
               (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
        ffpbyt(in_stack_ffffffffffffe918,(LONGLONG)status_00,fptr_00,
               &in_stack_ffffffffffffe900->HDUposition);
        in_stack_ffffffffffffe900 = status_00;
        if (0 < *local_28) {
          return *local_28;
        }
        local_40 = local_40 + 0xb40;
        fptr_01 = in_stack_ffffffffffffe900;
        ffmbyt(in_stack_ffffffffffffe8c8,
               CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
               in_stack_ffffffffffffe8bc,
               (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
        status_00 = fptr_00;
        ffgbyt(fptr_01,(LONGLONG)in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
               in_stack_ffffffffffffe8f0);
        fptr_00 = fptr_01;
      }
      *local_28 = local_2c;
      ffmbyt(in_stack_ffffffffffffe8c8,CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0)
             ,in_stack_ffffffffffffe8bc,
             (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
      ffpbyt(in_stack_ffffffffffffe918,(LONGLONG)status_00,fptr_00,
             &in_stack_ffffffffffffe900->HDUposition);
    }
    else {
      local_30 = *(undefined4 *)(*(long *)(local_10 + 8) + 0x54);
      local_2c = *local_28;
      while (*local_28 < 1) {
        ffmrhd(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c4,
               (int *)CONCAT44(in_stack_ffffffffffffe8bc,in_stack_ffffffffffffe8b8),
               (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
      }
      if (*local_28 == 0x6b) {
        *local_28 = local_2c;
      }
      ffmahd(in_stack_ffffffffffffe928,in_stack_ffffffffffffe924,
             &in_stack_ffffffffffffe918->HDUposition,&status_00->HDUposition);
      if (local_1c == -1) {
        ffmrec((fitsfile *)CONCAT44(in_stack_ffffffffffffe8bc,in_stack_ffffffffffffe8b8),
               in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8a8,(int *)0x167fb7);
      }
      local_58 = (*(long *)(*(long *)(*(long *)(local_10 + 8) + 0x68) +
                           (long)(*(int *)(*(long *)(local_10 + 8) + 0x60) + 1) * 8) - local_40) /
                 0xb40;
      local_48 = *(long *)(*(long *)(*(long *)(local_10 + 8) + 0x68) +
                          (long)(*(int *)(*(long *)(local_10 + 8) + 0x60) + 1) * 8);
      for (local_50 = 0; local_48 = local_48 + -0xb40, local_50 < local_58; local_50 = local_50 + 1)
      {
        iVar2 = ffmbyt(in_stack_ffffffffffffe8c8,
                       CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
                       in_stack_ffffffffffffe8bc,
                       (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
        if (0 < iVar2) {
          return *local_28;
        }
        ffgbyt(fptr_00,(LONGLONG)in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
               in_stack_ffffffffffffe8f0);
        ffmbyt(in_stack_ffffffffffffe8c8,
               CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
               in_stack_ffffffffffffe8bc,
               (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
        ffpbyt(in_stack_ffffffffffffe918,(LONGLONG)status_00,fptr_00,
               &in_stack_ffffffffffffe900->HDUposition);
      }
      ffmbyt(in_stack_ffffffffffffe8c8,CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0)
             ,in_stack_ffffffffffffe8bc,
             (int *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0));
      for (local_50 = 0; local_50 < local_18; local_50 = local_50 + 1) {
        ffpbyt(in_stack_ffffffffffffe918,(LONGLONG)status_00,fptr_00,
               &in_stack_ffffffffffffe900->HDUposition);
      }
    }
    if (local_1c == 0) {
      *(long *)(*(long *)(local_10 + 8) + 0x88) =
           local_18 * 0xb40 + *(long *)(*(long *)(local_10 + 8) + 0x88);
    }
    for (local_50 = (long)*(int *)(*(long *)(local_10 + 8) + 0x54);
        local_50 <= *(int *)(*(long *)(local_10 + 8) + 0x60); local_50 = local_50 + 1) {
      lVar1 = *(long *)(*(long *)(local_10 + 8) + 0x68);
      *(long *)(lVar1 + 8 + local_50 * 8) = local_18 * 0xb40 + *(long *)(lVar1 + 8 + local_50 * 8);
    }
    local_4 = *local_28;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffiblk(fitsfile *fptr,      /* I - FITS file pointer               */
           long nblock,         /* I - no. of blocks to insert         */ 
           int headdata,        /* I - insert where? 0=header, 1=data  */
                                /*     -1=beginning of file            */
           int *status)         /* IO - error status                   */
/*
   insert 2880-byte blocks at the end of the current header or data unit
*/
{
    int tstatus, savehdu, typhdu;
    LONGLONG insertpt, jpoint;
    long ii, nshift;
    char charfill;
    char buff1[2880], buff2[2880];
    char *inbuff, *outbuff, *tmpbuff;
    char card[FLEN_CARD];

    if (*status > 0 || nblock <= 0)
        return(*status);
        
    tstatus = *status;

    if (headdata == 0 || (fptr->Fptr)->hdutype == ASCII_TBL)
        charfill = 32;  /* headers and ASCII tables have space (32) fill */
    else
        charfill = 0;   /* images and binary tables have zero fill */

    if (headdata == 0)  
        insertpt = (fptr->Fptr)->datastart;  /* insert just before data, or */
    else if (headdata == -1)
    {
        insertpt = 0;
        strcpy(card, "XTENSION= 'IMAGE   '          / IMAGE extension");
    }
    else                                     /* at end of data, */
    {
        insertpt = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
        insertpt = ((insertpt + 2879) / 2880) * 2880; /* start of block */

       /* the following formula is wrong because the current data unit
          may have been extended without updating the headstart value
          of the following HDU.
       */
       /* insertpt = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1]; */
    }

    inbuff  = buff1;   /* set pointers to input and output buffers */
    outbuff = buff2;

    memset(outbuff, charfill, 2880); /* initialize buffer with fill */

    if (nblock == 1)  /* insert one block */
    {
      if (headdata == -1)
        ffmrec(fptr, 1, card, status);    /* change SIMPLE -> XTENSION */

      ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to 1st point */
      ffgbyt(fptr, 2880, inbuff, status);  /* read first block of bytes */

      while (*status <= 0)
      {
        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* insert point */
        ffpbyt(fptr, 2880, outbuff, status);  /* write the output buffer */

        if (*status > 0)
            return(*status);

        tmpbuff = inbuff;   /* swap input and output pointers */
        inbuff = outbuff;
        outbuff = tmpbuff;
        insertpt += 2880;  /* increment insert point by 1 block */

        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to next block */
        ffgbyt(fptr, 2880, inbuff, status);  /* read block of bytes */
      }

      *status = tstatus;  /* reset status value */
      ffmbyt(fptr, insertpt, IGNORE_EOF, status); /* move back to insert pt */
      ffpbyt(fptr, 2880, outbuff, status);  /* write the final block */
    }

    else   /*  inserting more than 1 block */

    {
        savehdu = (fptr->Fptr)->curhdu;  /* save the current HDU number */
        tstatus = *status;
        while(*status <= 0)  /* find the last HDU in file */
              ffmrhd(fptr, 1, &typhdu, status);

        if (*status == END_OF_FILE)
        {
            *status = tstatus;
        }

        ffmahd(fptr, savehdu + 1, &typhdu, status);  /* move back to CHDU */
        if (headdata == -1)
          ffmrec(fptr, 1, card, status); /* NOW change SIMPLE -> XTENSION */

        /* number of 2880-byte blocks that have to be shifted down */
        nshift = (long) (((fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - insertpt)
                 / 2880);
        /* position of last block in file to be shifted */
        jpoint =  (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - 2880;

        /* move all the blocks starting at end of file working backwards */
        for (ii = 0; ii < nshift; ii++)
        {
            /* move to the read start position */
            if (ffmbyt(fptr, jpoint, REPORT_EOF, status) > 0)
                return(*status);

            ffgbyt(fptr, 2880, inbuff,status);  /* read one record */

            /* move forward to the write postion */
            ffmbyt(fptr, jpoint + ((LONGLONG) nblock * 2880), IGNORE_EOF, status);

            ffpbyt(fptr, 2880, inbuff, status);  /* write the record */

            jpoint -= 2880;
        }

        /* move back to the write start postion (might be EOF) */
        ffmbyt(fptr, insertpt, IGNORE_EOF, status);

        for (ii = 0; ii < nblock; ii++)   /* insert correct fill value */
             ffpbyt(fptr, 2880, outbuff, status);
    }

    if (headdata == 0)         /* update data start address */
      (fptr->Fptr)->datastart += ((LONGLONG) nblock * 2880);

    /* update following HDU addresses */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] += ((LONGLONG) nblock * 2880);

    return(*status);
}